

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElfRelocator.cpp
# Opt level: O0

void __thiscall ElfRelocator::writeSymbols(ElfRelocator *this,SymbolData *symData)

{
  bool bVar1;
  reference pEVar2;
  reference pEVar3;
  ElfRelocatorSymbol *sym;
  const_iterator __end2;
  const_iterator __begin2;
  vector<ElfRelocatorSymbol,_std::allocator<ElfRelocatorSymbol>_> *__range2;
  ElfRelocatorFile *file;
  const_iterator __end1;
  const_iterator __begin1;
  vector<ElfRelocatorFile,_std::allocator<ElfRelocatorFile>_> *__range1;
  SymbolData *symData_local;
  ElfRelocator *this_local;
  
  __end1 = std::vector<ElfRelocatorFile,_std::allocator<ElfRelocatorFile>_>::begin(&this->files);
  file = (ElfRelocatorFile *)
         std::vector<ElfRelocatorFile,_std::allocator<ElfRelocatorFile>_>::end(&this->files);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_ElfRelocatorFile_*,_std::vector<ElfRelocatorFile,_std::allocator<ElfRelocatorFile>_>_>
                                     *)&file), bVar1) {
    pEVar2 = __gnu_cxx::
             __normal_iterator<const_ElfRelocatorFile_*,_std::vector<ElfRelocatorFile,_std::allocator<ElfRelocatorFile>_>_>
             ::operator*(&__end1);
    __end2 = std::vector<ElfRelocatorSymbol,_std::allocator<ElfRelocatorSymbol>_>::begin
                       (&pEVar2->symbols);
    sym = (ElfRelocatorSymbol *)
          std::vector<ElfRelocatorSymbol,_std::allocator<ElfRelocatorSymbol>_>::end
                    (&pEVar2->symbols);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_ElfRelocatorSymbol_*,_std::vector<ElfRelocatorSymbol,_std::allocator<ElfRelocatorSymbol>_>_>
                                       *)&sym), bVar1) {
      pEVar3 = __gnu_cxx::
               __normal_iterator<const_ElfRelocatorSymbol_*,_std::vector<ElfRelocatorSymbol,_std::allocator<ElfRelocatorSymbol>_>_>
               ::operator*(&__end2);
      SymbolData::addLabel(symData,pEVar3->relocatedAddress,&pEVar3->name);
      if (pEVar3->type == 1) {
        SymbolData::addData(symData,pEVar3->relocatedAddress,pEVar3->size,Data8);
      }
      else if (pEVar3->type == 2) {
        SymbolData::startFunction(symData,pEVar3->relocatedAddress);
        SymbolData::endFunction(symData,pEVar3->relocatedAddress + pEVar3->size);
      }
      __gnu_cxx::
      __normal_iterator<const_ElfRelocatorSymbol_*,_std::vector<ElfRelocatorSymbol,_std::allocator<ElfRelocatorSymbol>_>_>
      ::operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<const_ElfRelocatorFile_*,_std::vector<ElfRelocatorFile,_std::allocator<ElfRelocatorFile>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void ElfRelocator::writeSymbols(SymbolData& symData) const
{
	for (const ElfRelocatorFile& file: files)
	{
		for (const ElfRelocatorSymbol& sym: file.symbols)
		{
			symData.addLabel(sym.relocatedAddress, sym.name);

			switch (sym.type)
			{
			case STT_OBJECT:
				symData.addData(sym.relocatedAddress,sym.size,SymbolData::Data8);
				break;
			case STT_FUNC:
				symData.startFunction(sym.relocatedAddress);
				symData.endFunction(sym.relocatedAddress+sym.size);
				break;
			}
		}
	}
}